

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc_base_func.cpp
# Opt level: O2

uint32_t ivk::cmd_free(void *el)

{
  uint32_t uVar1;
  char *pcVar2;
  iterator iVar3;
  allocator local_39;
  key_type local_38;
  
  pcVar2 = get_attr_val((XMLElement **)el,"memory");
  if (pcVar2 == (char *)0x0) {
    uVar1 = 5;
  }
  else {
    std::__cxx11::string::string((string *)&local_38,pcVar2,&local_39);
    iVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>_>_>
                    *)gCmdMemMap_abi_cxx11_,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    if (iVar3._M_node == (_Base_ptr)(gCmdMemMap_abi_cxx11_ + 8)) {
      uVar1 = 7;
    }
    else {
      proc_data::clear((proc_data *)(iVar3._M_node + 2));
      std::__cxx11::string::string((string *)&local_38,pcVar2,&local_39);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>_>_>
      ::erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>_>_>
               *)gCmdMemMap_abi_cxx11_,&local_38);
      std::__cxx11::string::~string((string *)&local_38);
      uVar1 = 0;
    }
  }
  return uVar1;
}

Assistant:

uint32_t ivk::cmd_free(void *el) {
    XMLElement** ep = (XMLElement**)el;
    XMLElement* e = *(XMLElement**)el;

    const char* me = get_attr_val(ep,"memory");
    if(!me){
        return proc_xml_err;
    }

    map<string,proc_data>::iterator it = gCmdMemMap.find(me);
    if(it==gCmdMemMap.end()){
        return proc_mem_err;
    }

    // 需要手动释放资源,后期可能考虑用智能指针来管理
    it->second.clear();
    gCmdMemMap.erase(me);

    return proc_success;
}